

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::MethodDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,MethodDescriptor *this,DebugStringOptions *options)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  DebugString(this,0,__return_storage_ptr__,options);
  return __return_storage_ptr__;
}

Assistant:

std::string MethodDescriptor::DebugStringWithOptions(
    const DebugStringOptions& options) const {
  std::string contents;
  DebugString(0, &contents, options);
  return contents;
}